

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O1

void __thiscall
soplex::
LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::~LPRowBase(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *this)

{
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~DSVectorBase(&this->vec);
  if (((this->object).m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->object).m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->object).m_backend.m_value.den.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)(this->object).m_backend.m_value.den.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data.ld.capacity << 3);
  }
  if (((this->object).m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->object).m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->object).m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)(this->object).m_backend.m_value.num.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data.ld.capacity << 3);
  }
  if (((this->right).m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->right).m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->right).m_backend.m_value.den.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)(this->right).m_backend.m_value.den.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data.ld.capacity << 3);
  }
  if (((this->right).m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->right).m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->right).m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)(this->right).m_backend.m_value.num.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data.ld.capacity << 3);
  }
  if (((this->left).m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->left).m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->left).m_backend.m_value.den.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)(this->left).m_backend.m_value.den.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data.ld.capacity << 3);
  }
  if (((this->left).m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     ((this->left).m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(*(void **)((long)&(this->left).m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + 8),
                    (ulong)*(uint *)&(this->left).m_backend.m_value.num.m_backend.
                                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                     .m_data << 3);
    return;
  }
  return;
}

Assistant:

~LPRowBase()
   {}